

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Scene::draw_spline_curves(Scene *this,Timeline *timeline)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  pointer ppVar4;
  Timeline *in_RSI;
  long in_RDI;
  double dVar5;
  map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
  *this_00;
  Vector3D A;
  Vector3D T;
  Vector3D P;
  double t_1;
  KnotCIter k;
  Vector3D p0;
  double fractionThrough;
  double t0;
  float color;
  int ticks_per_line;
  double B;
  double G;
  double R;
  double tmpB;
  double tmpG;
  double tmpR;
  double hue;
  double tmp2;
  double tmp1;
  double sat;
  double lum;
  double frac;
  Vector3D p;
  double t;
  double maxTime;
  Spline<CS248::Vector3D> *spline;
  double alpha;
  bool selected;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range2;
  double controlPointScale;
  double tangentLengthScale;
  double nSamplesPerTick;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *in_stack_fffffffffffffde8;
  Vector3D *in_stack_fffffffffffffdf0;
  Vector3D *in_stack_fffffffffffffdf8;
  double in_stack_fffffffffffffe08;
  Spline<CS248::Vector3D> *in_stack_fffffffffffffe10;
  Spline<CS248::Vector3D> *in_stack_fffffffffffffe18;
  undefined8 local_1d0;
  Vector3D local_158;
  double local_140;
  iterator local_138;
  _Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> local_130;
  iterator local_128;
  _Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  double local_100;
  map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
  *local_f8;
  float local_f0;
  undefined4 local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  Vector3D *local_d0;
  double local_c8;
  Spline<CS248::Vector3D> *local_c0;
  double local_b8;
  double local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  double local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  Spline<CS248::Vector3D> *local_60;
  undefined8 local_58;
  byte local_49;
  SceneObject *local_48;
  _Self local_40;
  _Self local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  Timeline *local_10;
  
  local_18 = 0x3ff0000000000000;
  local_20 = 0x4014000000000000;
  local_28 = 0x4024000000000000;
  local_10 = in_RSI;
  glPushAttrib(0xfffff);
  glEnable(0xbe2);
  glDisable(0xb50);
  glBlendFunc(0x302,0x303);
  glEnable(0xb10);
  glHint(0xc51,0x1102);
  local_30 = in_RDI + 0x98;
  local_38._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_fffffffffffffde8);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::end(in_stack_fffffffffffffde8);
  while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
    ppSVar3 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffdf0);
    local_48 = *ppSVar3;
    local_49 = local_48 == *(SceneObject **)(in_RDI + 0x30);
    local_1d0 = 0x3ff0000000000000;
    if (!(bool)local_49) {
      local_1d0 = 0x3fe0000000000000;
    }
    local_58 = local_1d0;
    local_60 = &local_48->positions;
    iVar2 = Timeline::getMaxFrame(local_10);
    local_68 = (double)iVar2;
    glLineWidth();
    glColor4f();
    glBegin(3);
    for (local_70 = 0.0; local_70 <= local_68; local_70 = local_70 + 1.0) {
      Spline<CS248::Vector3D>::operator()
                ((Spline<CS248::Vector3D> *)in_stack_fffffffffffffdf8,
                 (double)in_stack_fffffffffffffdf0);
      local_b8 = local_70 / local_68;
      local_98 = 0x3fe0000000000000;
      local_a0 = 0x3ff0000000000000;
      local_a8 = 0x3ff0000000000000;
      local_b0 = 0.0;
      in_stack_fffffffffffffe18 = (Spline<CS248::Vector3D> *)(local_b8 + 0.333);
      in_stack_fffffffffffffdf8 = (Vector3D *)(local_b8 - 0.333);
      if (0.0 <= (double)in_stack_fffffffffffffe18) {
        in_stack_fffffffffffffe10 = in_stack_fffffffffffffe18;
        if (1.0 < (double)in_stack_fffffffffffffe18) {
          in_stack_fffffffffffffe18 =
               (Spline<CS248::Vector3D> *)((double)in_stack_fffffffffffffe18 - 1.0);
          in_stack_fffffffffffffe10 = in_stack_fffffffffffffe18;
        }
      }
      else {
        in_stack_fffffffffffffe18 =
             (Spline<CS248::Vector3D> *)((double)in_stack_fffffffffffffe18 + 1.0);
      }
      if (0.0 <= local_b8) {
        in_stack_fffffffffffffe08 = local_b8;
        if (1.0 < local_b8) {
          in_stack_fffffffffffffe08 = local_b8 - 1.0;
        }
      }
      else {
        in_stack_fffffffffffffe08 = local_b8 + 1.0;
      }
      if (0.0 <= (double)in_stack_fffffffffffffdf8) {
        in_stack_fffffffffffffdf0 = in_stack_fffffffffffffdf8;
        if (1.0 < (double)in_stack_fffffffffffffdf8) {
          in_stack_fffffffffffffdf8 = (Vector3D *)((double)in_stack_fffffffffffffdf8 - 1.0);
          in_stack_fffffffffffffdf0 = in_stack_fffffffffffffdf8;
        }
      }
      else {
        in_stack_fffffffffffffdf8 = (Vector3D *)((double)in_stack_fffffffffffffdf8 + 1.0);
      }
      if (1.0 <= (double)in_stack_fffffffffffffe18 * 6.0) {
        if (1.0 <= (double)in_stack_fffffffffffffe18 * 2.0) {
          local_d8 = local_b0;
          if ((double)in_stack_fffffffffffffe18 * 3.0 < 2.0) {
            local_d8 = (0.666 - (double)in_stack_fffffffffffffe18) * 1.0 * 6.0 + 0.0;
          }
        }
        else {
          local_d8 = 1.0;
        }
      }
      else {
        local_d8 = (double)in_stack_fffffffffffffe18 * 6.0 + 0.0;
      }
      if (1.0 <= in_stack_fffffffffffffe08 * 6.0) {
        if (1.0 <= in_stack_fffffffffffffe08 * 2.0) {
          local_e0 = local_b0;
          if (in_stack_fffffffffffffe08 * 3.0 < 2.0) {
            local_e0 = (0.666 - in_stack_fffffffffffffe08) * 1.0 * 6.0 + 0.0;
          }
        }
        else {
          local_e0 = 1.0;
        }
      }
      else {
        local_e0 = in_stack_fffffffffffffe08 * 6.0 + 0.0;
      }
      if (1.0 <= (double)in_stack_fffffffffffffdf8 * 6.0) {
        if (1.0 <= (double)in_stack_fffffffffffffdf8 * 2.0) {
          local_e8 = local_b0;
          if ((double)in_stack_fffffffffffffdf8 * 3.0 < 2.0) {
            local_e8 = (0.666 - (double)in_stack_fffffffffffffdf8) * 1.0 * 6.0 + 0.0;
          }
        }
        else {
          local_e8 = 1.0;
        }
      }
      else {
        local_e8 = (double)in_stack_fffffffffffffdf8 * 6.0 + 0.0;
      }
      local_d0 = in_stack_fffffffffffffdf8;
      local_c8 = in_stack_fffffffffffffe08;
      local_c0 = in_stack_fffffffffffffe18;
      local_90 = local_b8;
      glDisable(0xbe2);
      local_ec = 0x14;
      dVar5 = sqrt((double)((int)local_70 % 0x14) / 19.0);
      local_f0 = (float)dVar5;
      glColor4f();
      glVertex3d(local_88,local_80,local_78);
      glEnable(0xbe2);
    }
    glEnd();
    if ((local_49 & 1) != 0) {
      iVar2 = Timeline::getCurrentFrame(local_10);
      this_00 = (map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
                 *)(double)iVar2;
      local_f8 = this_00;
      iVar2 = Timeline::getMaxFrame(local_10);
      local_100 = (double)this_00 / (double)iVar2;
      Spline<CS248::Vector3D>::operator()
                ((Spline<CS248::Vector3D> *)in_stack_fffffffffffffdf8,
                 (double)in_stack_fffffffffffffdf0);
      glColor4f();
      glPointSize();
      glBegin(0);
      glVertex3d(local_118,local_110,local_108);
      glEnd();
      local_128._M_node =
           (_Base_ptr)
           std::
           map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
           ::begin(this_00);
      std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::
      _Rb_tree_const_iterator(&local_120,&local_128);
      while( true ) {
        local_138._M_node =
             (_Base_ptr)
             std::
             map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
             ::end(this_00);
        std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::
        _Rb_tree_const_iterator(&local_130,&local_138);
        bVar1 = std::operator!=(&local_120,&local_130);
        if (!bVar1) break;
        ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
                            in_stack_fffffffffffffdf0);
        local_140 = ppVar4->first;
        ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
                            in_stack_fffffffffffffdf0);
        Vector3D::Vector3D(&local_158,&ppVar4->second);
        Spline<CS248::Vector3D>::evaluate
                  (in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10,
                   (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        CS248::operator*(&in_stack_fffffffffffffdf8->x,in_stack_fffffffffffffdf0);
        Spline<CS248::Vector3D>::evaluate
                  (in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10,
                   (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        CS248::operator*(&in_stack_fffffffffffffdf8->x,in_stack_fffffffffffffdf0);
        glColor4f();
        glPointSize();
        glBegin(0);
        glVertex3d(local_158.x,local_158.y,local_158.z);
        glEnd();
        std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
                   in_stack_fffffffffffffdf8,(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      }
    }
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffdf0);
  }
  glEnable(0xb50);
  glPopAttrib();
  return;
}

Assistant:

void Scene::draw_spline_curves(Timeline &timeline) {
  const double nSamplesPerTick = 1.;
  const double tangentLengthScale = 5.;
  const double controlPointScale = 10.;

  glPushAttrib(GL_ALL_ATTRIB_BITS);

  glEnable(GL_BLEND);
  glDisable(GL_LIGHTING);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

  // use round (rather than square) points
  glEnable(GL_POINT_SMOOTH);
  glHint(GL_POINT_SMOOTH_HINT, GL_NICEST);
  for (SceneObject *obj : objects) {
    bool selected = (obj == this->selected.object);
    double alpha = selected ? 1. : .5;
    Spline<Vector3D> &spline = obj->positions;
    // approximate spline by line segments
    const double maxTime = timeline.getMaxFrame();
    glLineWidth(3.);
    glColor4f(1., 1., 1., alpha);
    glBegin(GL_LINE_STRIP);
    for (double t = 0; t <= maxTime; t += 1. / nSamplesPerTick) {
      Vector3D p = spline(t);

      /* Zach: This is all complicated stuff to make the spline appear as
       * shifting
       * in hue as time progresses, to give an impression of how fast it's going
       */
      double frac = t / maxTime;
      double lum = 0.5;
      double sat = 1.0;
      double tmp1 = (lum < 0.5) ? (lum * (1.0 + sat)) : (lum + sat - lum * sat);
      double tmp2 = 2 * lum - tmp1;
      double hue = frac;
      double tmpR = hue + 0.333;
      double tmpG = hue;
      double tmpB = hue - 0.333;
      tmpR = (tmpR < 0) ? (tmpR + 1) : ((tmpR > 1) ? (tmpR - 1) : tmpR);
      tmpG = (tmpG < 0) ? (tmpG + 1) : ((tmpG > 1) ? (tmpG - 1) : tmpG);
      tmpB = (tmpB < 0) ? (tmpB + 1) : ((tmpB > 1) ? (tmpB - 1) : tmpB);

      double R = 1.0, G = 1.0, B = 1.0;
      if (6 * tmpR < 1) {
        R = tmp2 + (tmp1 - tmp2) * 6 * tmpR;
      } else if (2 * tmpR < 1) {
        R = tmp1;
      } else if (3 * tmpR < 2) {
        R = tmp2 + (tmp1 - tmp2) * (0.666 - tmpR) * 6;
      } else {
        R = tmp2;
      }

      if (6 * tmpG < 1) {
        G = tmp2 + (tmp1 - tmp2) * 6 * tmpG;
      } else if (2 * tmpG < 1) {
        G = tmp1;
      } else if (3 * tmpG < 2) {
        G = tmp2 + (tmp1 - tmp2) * (0.666 - tmpG) * 6;
      } else {
        G = tmp2;
      }

      if (6 * tmpB < 1) {
        B = tmp2 + (tmp1 - tmp2) * 6 * tmpB;
      } else if (2 * tmpB < 1) {
        B = tmp1;
      } else if (3 * tmpB < 2) {
        B = tmp2 + (tmp1 - tmp2) * (0.666 - tmpB) * 6;
      } else {
        B = tmp2;
      }

      glDisable(GL_BLEND);
      int ticks_per_line = 20;
      float color = sqrt(((int)t % ticks_per_line) / (ticks_per_line - 1.0));

      glColor4f(color, color, 1.0, 1.0);
      glVertex3d(p.x, p.y, p.z);
      glEnable(GL_BLEND);
    }
    glEnd();
    if (selected) {
      // draw dot for current position
      double t0 = timeline.getCurrentFrame();
      double fractionThrough = t0 / timeline.getMaxFrame();
      Vector3D p0 = spline(t0);
      glColor4f(1., 1., 1., alpha);
      glPointSize(controlPointScale * 1.5);
      glBegin(GL_POINTS);
      glVertex3d(p0.x, p0.y, p0.z);
      glEnd();
      // draw control points, tangents, and curvature
      for (Spline<Vector3D>::KnotCIter k = spline.knots.begin();
           k != spline.knots.end(); k++) {
        double t = k->first;
        Vector3D P = k->second;                                   // position
        Vector3D T = tangentLengthScale * spline.evaluate(t, 1);  // tangent
        Vector3D A =
            tangentLengthScale * spline.evaluate(t, 2);  // acceleration
        glColor4f(1., 1., 1., alpha);
        glPointSize(controlPointScale);
        glBegin(GL_POINTS);
        glVertex3d(P.x, P.y, P.z);
        glEnd();
      }
    }
  }
  glEnable(GL_LIGHTING);
  glPopAttrib();
}